

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O1

int nn_bipc_create(nn_ep *ep)

{
  int iVar1;
  int iVar2;
  nn_bipc *self;
  nn_ctx *ctx;
  char *__s;
  size_t sVar3;
  int *piVar4;
  nn_usock *self_00;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  self = (nn_bipc *)nn_alloc_(0x2e0);
  if (self == (nn_bipc *)0x0) {
    nn_bipc_create_cold_5();
LAB_0012906a:
    nn_bipc_create_cold_4();
LAB_0012906f:
    nn_bipc_create_cold_3();
  }
  else {
    self->ep = ep;
    nn_ep_tran_setup(ep,&nn_bipc_ep_ops,self);
    ctx = nn_ep_getctx(ep);
    nn_fsm_init_root((nn_fsm *)self,nn_bipc_handler,nn_bipc_shutdown,ctx);
    self->state = 1;
    self->aipc = (nn_aipc *)0x0;
    nn_list_init(&self->aipcs);
    nn_fsm_start((nn_fsm *)self);
    self_00 = &self->usock;
    nn_usock_init(self_00,1,(nn_fsm *)self);
    __s = nn_ep_getaddr(self->ep);
    local_a8.sa_family = 0;
    local_a8.sa_data[0] = '\0';
    local_a8.sa_data[1] = '\0';
    local_a8.sa_data[2] = '\0';
    local_a8.sa_data[3] = '\0';
    local_a8.sa_data[4] = '\0';
    local_a8.sa_data[5] = '\0';
    local_a8.sa_data[6] = '\0';
    local_a8.sa_data[7] = '\0';
    local_a8.sa_data[8] = '\0';
    local_a8.sa_data[9] = '\0';
    local_a8.sa_data[10] = '\0';
    local_a8.sa_data[0xb] = '\0';
    local_a8.sa_data[0xc] = '\0';
    local_a8.sa_data[0xd] = '\0';
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    uStack_30 = 0;
    sVar3 = strlen(__s);
    if (0x6b < sVar3) goto LAB_0012906a;
    local_a8.sa_family = 1;
    strncpy(local_a8.sa_data,__s,0x6c);
    iVar1 = socket(1,1,0);
    if (iVar1 < 0) {
LAB_00128ffc:
      iVar1 = nn_usock_start(self_00,1,1,0);
      if (-1 < iVar1) {
        iVar1 = nn_usock_bind(self_00,&local_a8,0x6e);
        if ((iVar1 < 0) || (iVar1 = nn_usock_listen(self_00,10), iVar1 < 0)) {
          nn_usock_stop(self_00);
        }
        else {
          nn_bipc_start_accepting(self);
          iVar1 = 0;
        }
      }
      return iVar1;
    }
    iVar2 = fcntl(iVar1,4,0x800);
    if ((iVar2 != -1) || (piVar4 = __errno_location(), *piVar4 == 0x16)) {
      iVar2 = connect(iVar1,(sockaddr *)&local_a8,0x6e);
      if ((iVar2 == -1) &&
         (((piVar4 = __errno_location(), *piVar4 == 0x6f && (iVar2 = unlink(__s), iVar2 != 0)) &&
          (*piVar4 != 2)))) goto LAB_0012907c;
      iVar1 = close(iVar1);
      if (iVar1 == 0) goto LAB_00128ffc;
      goto LAB_0012906f;
    }
  }
  nn_bipc_create_cold_1();
LAB_0012907c:
  nn_bipc_create_cold_2();
}

Assistant:

int nn_bipc_create (struct nn_ep *ep)
{
    struct nn_bipc *self;
    int rc;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_bipc), "bipc");
    alloc_assert (self);


    /*  Initialise the structure. */
    self->ep = ep;
    nn_ep_tran_setup (ep, &nn_bipc_ep_ops, self);
    nn_fsm_init_root (&self->fsm, nn_bipc_handler, nn_bipc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_BIPC_STATE_IDLE;
    self->aipc = NULL;
    nn_list_init (&self->aipcs);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    nn_usock_init (&self->usock, NN_BIPC_SRC_USOCK, &self->fsm);

    rc = nn_bipc_listen (self);
    if (rc != 0) {
        return rc;
    }

    return 0;
}